

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

void H3_public_key_message
               (hash_context *ctx,picnic_instance_t *pp,uint8_t *salt,picnic_context_t *context)

{
  Keccak_HashUpdate(ctx,context->public_key,(ulong)pp->input_output_size << 3);
  Keccak_HashUpdate(ctx,context->plaintext,(ulong)pp->input_output_size << 3);
  Keccak_HashUpdate(ctx,salt,0x100);
  Keccak_HashUpdate(ctx,context->msg,context->msglen << 3);
  return;
}

Assistant:

static void H3_public_key_message(hash_context* ctx, const picnic_instance_t* pp,
                                  const uint8_t* salt, const picnic_context_t* context) {
  // hash circuit out and input (public key)
  hash_update(ctx, context->public_key, pp->input_output_size);
  hash_update(ctx, context->plaintext, pp->input_output_size);
  // hash salt
  hash_update(ctx, salt, SALT_SIZE);
  // hash message
  hash_update(ctx, context->msg, context->msglen);
}